

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_gemv_square_LDSame<std::complex<double>,std::complex<double>,(char)84>(void)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  complex<double> BETA_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  quaternion<double> *x;
  pointer pqVar12;
  pointer pqVar13;
  undefined1 auVar14 [16];
  result_type_conflict1 in_XMM0_Qa;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  result_type_conflict1 in_XMM1_Qa;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  complex<double> ALPHA_00;
  int32_t INCX;
  result_type_conflict1 in_stack_fffffffffffffc88;
  undefined8 uVar21;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 uVar22;
  quaternion<double> *in_stack_fffffffffffffc98;
  undefined8 uVar23;
  int32_t INCY;
  undefined8 in_stack_fffffffffffffca0;
  complex<double> ALPHA;
  complex<double> BETA;
  quaternion<double> local_330;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  undefined1 local_2a8 [8];
  undefined8 local_2a0;
  shared_count sStack_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  char **local_220;
  double local_218;
  double dStack_210;
  double dStack_208;
  double dStack_200;
  quaternion<double> __r;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  for (pqVar13 = X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pqVar12 = Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pqVar13 !=
      X.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar13 = pqVar13 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc98 =
         (quaternion<double> *)std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc88 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar13->_M_real = in_XMM1_Qa;
    pqVar13->_M_imag_i = (double)in_stack_fffffffffffffc98;
    pqVar13->_M_imag_j = in_stack_fffffffffffffc88;
    pqVar13->_M_imag_k = in_XMM0_Qa;
  }
  for (; pqVar13 = A.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      pqVar12 !=
      Y.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar12 = pqVar12 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc98 =
         (quaternion<double> *)std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc88 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar12->_M_real = in_XMM1_Qa;
    pqVar12->_M_imag_i = (double)in_stack_fffffffffffffc98;
    pqVar12->_M_imag_j = in_stack_fffffffffffffc88;
    pqVar12->_M_imag_k = in_XMM0_Qa;
  }
  for (; INCY = (int32_t)in_stack_fffffffffffffca0,
      pqVar13 !=
      A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar13 = pqVar13 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc98 =
         (quaternion<double> *)std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc88 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar13->_M_real = in_XMM1_Qa;
    pqVar13->_M_imag_i = (double)in_stack_fffffffffffffc98;
    pqVar13->_M_imag_j = in_stack_fffffffffffffc88;
    pqVar13->_M_imag_k = in_XMM0_Qa;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&YC,&Y);
  genRandom<std::complex<double>>();
  ALPHA._M_value._0_8_ = in_XMM0_Qa;
  ALPHA._M_value._8_8_ = in_XMM1_Qa;
  genRandom<std::complex<double>>();
  BETA._M_value._0_8_ = in_XMM0_Qa;
  BETA._M_value._8_8_ = in_XMM1_Qa;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar9 = std::operator<<(local_1a8,"hblas2_gemv_square_");
  std::operator<<(poVar9,'T');
  std::operator<<(local_1a8,"C");
  std::operator<<(local_1a8,"C");
  std::operator<<(local_1a8,"_LDSame");
  std::__cxx11::stringbuf::str();
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&local_330);
  poVar9 = std::operator<<(poVar9," will use");
  std::endl<char,std::char_traits<char>>(poVar9);
  std::__cxx11::string::~string((string *)&local_330);
  poVar9 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  poVar9 = std::operator<<(poVar9,(complex *)&ALPHA);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"  BETA = ");
  poVar9 = std::operator<<(poVar9,(complex *)&BETA);
  INCX = 0x153c88;
  std::endl<char,std::char_traits<char>>(poVar9);
  BETA_00._M_value._8_8_ = in_stack_fffffffffffffc90;
  BETA_00._M_value._0_8_ = in_stack_fffffffffffffc88;
  ALPHA_00._M_value._8_8_ =
       X.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ALPHA_00._M_value._0_8_ = 100;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,std::complex<double>>
            ((HAXX *)0x54,'d',100,
             (int32_t)A.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,ALPHA_00,(quaternion<double> *)0x1,
             (int32_t)Y.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(quaternion<double> *)0x1,INCX,
             BETA_00,in_stack_fffffffffffffc98,INCY);
  lVar10 = 0;
  for (lVar11 = 0; lVar11 != 320000; lVar11 = lVar11 + 0xc80) {
    HAXX::HBLAS_DOTUV<double>
              (&local_330,100,
               (quaternion<double> *)
               ((long)&(A.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar11),1,
               X.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1);
    dVar8 = local_330._M_imag_k;
    dVar7 = local_330._M_imag_j;
    dVar6 = local_330._M_imag_i;
    dVar5 = local_330._M_real;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_258 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x47,&local_270);
    uVar22 = 0;
    uVar21 = ALPHA._M_value._8_8_;
    uVar23 = ALPHA._M_value._0_8_;
    HAXX::operator*(&BETA,(quaternion<double> *)
                          ((long)&(YC.
                                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar10));
    auVar3._8_8_ = uVar22;
    auVar3._0_8_ = uVar21;
    auVar4._8_8_ = dVar6;
    auVar4._0_8_ = dVar5;
    auVar4._16_8_ = dVar7;
    auVar4._24_8_ = dVar8;
    auVar20._8_8_ = uVar23;
    auVar20._0_8_ = uVar23;
    auVar20._16_8_ = uVar23;
    auVar20._24_8_ = uVar23;
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar3,auVar14);
    auVar14 = vunpcklpd_avx(auVar14,auVar3);
    auVar1 = vshufpd_avx(auVar4,auVar4,5);
    auVar2 = vpermpd_avx2(ZEXT1632(auVar14),0x44);
    auVar16._0_8_ = auVar1._0_8_ * auVar2._0_8_;
    auVar16._8_8_ = auVar1._8_8_ * auVar2._8_8_;
    auVar16._16_8_ = auVar1._16_8_ * auVar2._16_8_;
    auVar16._24_8_ = auVar1._24_8_ * auVar2._24_8_;
    auVar14 = vfmadd213pd_fma(auVar20,auVar4,auVar16);
    __r._M_real = auVar14._0_8_ + local_218;
    __r._M_imag_i = auVar14._8_8_ + dStack_210;
    __r._M_imag_j = dStack_208 + 0.0;
    __r._M_imag_k = dStack_200 + 0.0;
    HAXX::inv<double>(&local_1d8,
                      (quaternion<double> *)
                      ((long)&(Y.
                               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar10));
    HAXX::operator*(&local_330,&__r,&local_1d8);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_330._M_imag_i;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_330._M_imag_j;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_330._M_imag_k;
    local_230 = 0;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = (local_330._M_real + -1.0) * (local_330._M_real + -1.0);
    auVar14 = vfmadd231sd_fma(auVar19,auVar15,auVar15);
    auVar14 = vfmadd231sd_fma(auVar14,auVar17,auVar17);
    auVar14 = vfmadd231sd_fma(auVar14,auVar18,auVar18);
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    local_2a8[0] = auVar14._0_8_ < 1e-12;
    local_2a0 = 0;
    sStack_298.pi_ = (sp_counted_base *)0x0;
    local_280 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_278 = "";
    local_238 = &PTR__lazy_ostream_00219908;
    local_228 = &boost::unit_test::lazy_ostream::inst;
    local_220 = &local_280;
    local_290 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_288 = "";
    boost::test_tools::tt_detail::report_assertion(local_2a8,&local_238,&local_290,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_298);
    lVar10 = lVar10 + 0x20;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&YC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}